

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

int nn_create_socket(nn_options_t *options)

{
  char *__s;
  uint sock;
  int iVar1;
  size_t sVar2;
  int millis;
  
  sock = nn_socket(1,options->socket_type);
  nn_assert_errno(~sock >> 0x1f,"Can\'t create socket");
  if (0.0 <= options->send_timeout) {
    millis = (int)(options->send_timeout * 1000.0);
    iVar1 = nn_setsockopt(sock,0,4,&millis,4);
    nn_assert_errno((uint)(iVar1 == 0),"Can\'t set send timeout");
  }
  if (0.0 <= options->recv_timeout) {
    nn_set_recv_timeout(sock,(int)options->recv_timeout * 1000);
  }
  __s = options->socket_name;
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    iVar1 = nn_setsockopt(sock,0,0xf,__s,sVar2);
    nn_assert_errno((uint)(iVar1 == 0),"Can\'t set socket name");
  }
  if (options->socket_type == 0x21) {
    nn_sub_init(options,sock);
  }
  return sock;
}

Assistant:

int nn_create_socket (nn_options_t *options)
{
    int sock;
    int rc;
    int millis;

    sock = nn_socket (AF_SP, options->socket_type);
    nn_assert_errno (sock >= 0, "Can't create socket");

    /* Generic initialization */
    if (options->send_timeout >= 0) {
        millis = (int)(options->send_timeout * 1000);
        rc = nn_setsockopt (sock, NN_SOL_SOCKET, NN_SNDTIMEO,
                           &millis, sizeof (millis));
        nn_assert_errno (rc == 0, "Can't set send timeout");
    }
    if (options->recv_timeout >= 0) {
        nn_set_recv_timeout (sock, (int) options->recv_timeout * 1000);
    }
    if (options->socket_name) {
        rc = nn_setsockopt (sock, NN_SOL_SOCKET, NN_SOCKET_NAME,
                           options->socket_name, strlen(options->socket_name));
        nn_assert_errno (rc == 0, "Can't set socket name");
    }

    /* Specific initialization */
    switch (options->socket_type) {
    case NN_SUB:
        nn_sub_init (options, sock);
        break;
    }

    return sock;
}